

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void btreeParseCellPtr(MemPage *pPage,u8 *pCell,CellInfo *pInfo)

{
  ushort uVar1;
  u8 uVar2;
  byte bVar3;
  byte bVar4;
  undefined8 in_RAX;
  ulong uVar5;
  uint uVar6;
  u16 uVar7;
  uchar *puVar8;
  uint local_34;
  
  uVar6 = (uint)((ulong)in_RAX >> 0x20);
  if (pPage->intKeyLeaf == '\0') {
    if (pPage->noPayload != '\0') {
      uVar2 = sqlite3GetVarint(pCell + 4,(u64 *)pInfo);
      pInfo->nSize = (ushort)(byte)(uVar2 + 4);
      pInfo->pPayload = (u8 *)0x0;
      pInfo->nPayload = 0;
      pInfo->nLocal = 0;
      pInfo->iOverflow = 0;
      return;
    }
    bVar3 = pPage->childPtrSize;
    local_34 = (uint)(char)pCell[bVar3];
    if ((char)pCell[bVar3] < '\0') {
      local_34 = uVar6;
      bVar4 = sqlite3GetVarint32(pCell + bVar3,&local_34);
      uVar5 = (ulong)bVar4;
    }
    else {
      uVar5 = 1;
    }
    puVar8 = pCell + bVar3 + uVar5;
    pInfo->nKey = (ulong)local_34;
  }
  else {
    if ((char)*pCell < '\0') {
      local_34 = uVar6;
      bVar3 = sqlite3GetVarint32(pCell,&local_34);
      uVar5 = (ulong)bVar3;
    }
    else {
      uVar5 = 1;
      local_34 = (int)(char)*pCell;
    }
    bVar3 = sqlite3GetVarint(pCell + uVar5,(u64 *)pInfo);
    puVar8 = pCell + uVar5 + bVar3;
  }
  pInfo->nPayload = local_34;
  pInfo->pPayload = puVar8;
  if (pPage->maxLocal < local_34) {
    uVar1 = pPage->minLocal;
    uVar6 = (local_34 - uVar1) % (pPage->pBt->usableSize - 4) + (uint)uVar1;
    if ((int)(uint)pPage->maxLocal < (int)uVar6) {
      uVar6 = (uint)uVar1;
    }
    pInfo->nLocal = (u16)uVar6;
    uVar7 = ((short)puVar8 + (u16)uVar6) - (short)pCell;
    pInfo->iOverflow = uVar7;
    pInfo->nSize = uVar7 + 4;
  }
  else {
    uVar6 = ((int)puVar8 - (int)pCell) + local_34;
    uVar7 = 4;
    if ((uVar6 & 0xfffc) != 0) {
      uVar7 = (u16)uVar6;
    }
    pInfo->nSize = uVar7;
    pInfo->nLocal = (u16)local_34;
    pInfo->iOverflow = 0;
  }
  return;
}

Assistant:

static void btreeParseCellPtr(
  MemPage *pPage,         /* Page containing the cell */
  u8 *pCell,              /* Pointer to the cell text. */
  CellInfo *pInfo         /* Fill in this structure */
){
  u8 *pIter;              /* For scanning through pCell */
  u32 nPayload;           /* Number of bytes of cell payload */

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->leaf==0 || pPage->leaf==1 );
  if( pPage->intKeyLeaf ){
    assert( pPage->childPtrSize==0 );
    pIter = pCell + getVarint32(pCell, nPayload);
    pIter += getVarint(pIter, (u64*)&pInfo->nKey);
  }else if( pPage->noPayload ){
    assert( pPage->childPtrSize==4 );
    pInfo->nSize = 4 + getVarint(&pCell[4], (u64*)&pInfo->nKey);
    pInfo->nPayload = 0;
    pInfo->nLocal = 0;
    pInfo->iOverflow = 0;
    pInfo->pPayload = 0;
    return;
  }else{
    pIter = pCell + pPage->childPtrSize;
    pIter += getVarint32(pIter, nPayload);
    pInfo->nKey = nPayload;
  }
  pInfo->nPayload = nPayload;
  pInfo->pPayload = pIter;
  testcase( nPayload==pPage->maxLocal );
  testcase( nPayload==pPage->maxLocal+1 );
  if( nPayload<=pPage->maxLocal ){
    /* This is the (easy) common case where the entire payload fits
    ** on the local page.  No overflow is required.
    */
    pInfo->nSize = nPayload + (u16)(pIter - pCell);
    if( pInfo->nSize<4 ) pInfo->nSize = 4;
    pInfo->nLocal = (u16)nPayload;
    pInfo->iOverflow = 0;
  }else{
    /* If the payload will not fit completely on the local page, we have
    ** to decide how much to store locally and how much to spill onto
    ** overflow pages.  The strategy is to minimize the amount of unused
    ** space on overflow pages while keeping the amount of local storage
    ** in between minLocal and maxLocal.
    **
    ** Warning:  changing the way overflow payload is distributed in any
    ** way will result in an incompatible file format.
    */
    int minLocal;  /* Minimum amount of payload held locally */
    int maxLocal;  /* Maximum amount of payload held locally */
    int surplus;   /* Overflow payload available for local storage */

    minLocal = pPage->minLocal;
    maxLocal = pPage->maxLocal;
    surplus = minLocal + (nPayload - minLocal)%(pPage->pBt->usableSize - 4);
    testcase( surplus==maxLocal );
    testcase( surplus==maxLocal+1 );
    if( surplus <= maxLocal ){
      pInfo->nLocal = (u16)surplus;
    }else{
      pInfo->nLocal = (u16)minLocal;
    }
    pInfo->iOverflow = (u16)(&pInfo->pPayload[pInfo->nLocal] - pCell);
    pInfo->nSize = pInfo->iOverflow + 4;
  }
}